

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>
::Intrusive_list_column
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>
           *this,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>
                 *column)

{
  Dimension DVar1;
  ID_index IVar2;
  Index IVar3;
  Field_operators *pFVar4;
  Entry_constructor *pEVar5;
  
  DVar1 = (column->super_Column_dimension_option).dim_;
  (column->super_Column_dimension_option).dim_ = -1;
  (this->super_Column_dimension_option).dim_ = DVar1;
  IVar2 = (column->super_Chain_column_option).pivot_;
  (column->super_Chain_column_option).pivot_ = 0xffffffff;
  (this->super_Chain_column_option).pivot_ = IVar2;
  IVar3 = (column->super_Chain_column_option).pairedColumn_;
  (column->super_Chain_column_option).pairedColumn_ = 0xffffffff;
  (this->super_Chain_column_option).pairedColumn_ = IVar3;
  pFVar4 = column->operators_;
  column->operators_ = (Field_operators *)0x0;
  this->operators_ = pFVar4;
  pEVar5 = column->entryPool_;
  column->entryPool_ = (Entry_constructor *)0x0;
  this->entryPool_ = pEVar5;
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  ::list_impl(&(this->column_).super_type,&(column->column_).super_type);
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(Intrusive_list_column&& column) noexcept
    : RA_opt(std::move(static_cast<RA_opt&>(column))),
      Dim_opt(std::move(static_cast<Dim_opt&>(column))),
      Chain_opt(std::move(static_cast<Chain_opt&>(column))),
      operators_(std::exchange(column.operators_, nullptr)),
      entryPool_(std::exchange(column.entryPool_, nullptr)),
      column_(std::move(column.column_))
{}